

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::lts_20250127::str_format_internal::anon_unknown_0::FormatARound<unsigned_long>
               (bool precision_specified,FormatState *state,uint8_t *leading,unsigned_long *mantissa
               ,int *exp)

{
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  size_t local_50;
  bool overflow;
  size_t final_nibble_displayed;
  size_t kTotalNibbles;
  int *exp_local;
  unsigned_long *mantissa_local;
  uint8_t *leading_local;
  FormatState *state_local;
  bool precision_specified_local;
  
  final_nibble_displayed = 0x10;
  kTotalNibbles = (size_t)exp;
  exp_local = (int *)mantissa;
  mantissa_local = (unsigned_long *)leading;
  leading_local = (uint8_t *)state;
  state_local._7_1_ = precision_specified;
  if (precision_specified) {
    puVar2 = std::max<unsigned_long>(&final_nibble_displayed,&state->precision);
    local_50 = *puVar2 - *(long *)(leading_local + 8);
  }
  else {
    local_50 = 0;
  }
  bVar1 = HexFloatNeedsRoundUp<unsigned_long>
                    (*(unsigned_long *)exp_local,local_50,(uint8_t)*mantissa_local);
  if (bVar1) {
    bVar1 = IncrementNibble<unsigned_long>(local_50,(unsigned_long *)exp_local);
    *(char *)mantissa_local = (char)*mantissa_local + bVar1;
    if (0xf < (byte)*mantissa_local) {
      *(undefined1 *)mantissa_local = 1;
      exp_local[0] = 0;
      exp_local[1] = 0;
      *(int *)kTotalNibbles = *(int *)kTotalNibbles + 4;
    }
  }
  if ((state_local._7_1_ & 1) != 0) {
    uVar3 = MaskUpToNibbleExclusive<unsigned_long>(local_50);
    *(unsigned_long *)exp_local = (uVar3 ^ 0xffffffffffffffff) & *(ulong *)exp_local;
  }
  return;
}

Assistant:

void FormatARound(bool precision_specified, const FormatState &state,
                  uint8_t *leading, Int *mantissa, int *exp) {
  constexpr size_t kTotalNibbles = sizeof(Int) * 8 / 4;
  // Index of the last nibble that we could display given precision.
  size_t final_nibble_displayed =
      precision_specified
          ? (std::max(kTotalNibbles, state.precision) - state.precision)
          : 0;
  if (HexFloatNeedsRoundUp(*mantissa, final_nibble_displayed, *leading)) {
    // Need to round up.
    bool overflow = IncrementNibble(final_nibble_displayed, mantissa);
    *leading += (overflow ? 1 : 0);
    if (ABSL_PREDICT_FALSE(*leading > 15)) {
      // We have overflowed the leading digit. This would mean that we would
      // need two hex digits to the left of the dot, which is not allowed. So
      // adjust the mantissa and exponent so that the result is always 1.0eXXX.
      *leading = 1;
      *mantissa = 0;
      *exp += 4;
    }
  }
  // Now that we have handled a possible round-up we can go ahead and zero out
  // all the nibbles of the mantissa that we won't need.
  if (precision_specified) {
    *mantissa &= ~MaskUpToNibbleExclusive<Int>(final_nibble_displayed);
  }
}